

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

CommandSignature __thiscall
anon_unknown.dwarf_16ac71::SwiftCompilerShellCommand::getSignature(SwiftCompilerShellCommand *this)

{
  CommandSignature *pCVar1;
  CommandSignature local_10;
  
  local_10 = llbuild::buildsystem::ExternalCommand::getSignature(&this->super_ExternalCommand);
  pCVar1 = llbuild::basic::CommandSignature::combine(&local_10,&this->executable);
  pCVar1 = llbuild::basic::CommandSignature::combine(pCVar1,&this->moduleName);
  pCVar1 = llbuild::basic::CommandSignature::combine<std::__cxx11::string>
                     (pCVar1,&this->moduleAliases);
  pCVar1 = llbuild::basic::CommandSignature::combine(pCVar1,&this->moduleOutputPath);
  pCVar1 = llbuild::basic::CommandSignature::combine<std::__cxx11::string>
                     (pCVar1,&this->sourcesList);
  pCVar1 = llbuild::basic::CommandSignature::combine<std::__cxx11::string>
                     (pCVar1,&this->objectsList);
  pCVar1 = llbuild::basic::CommandSignature::combine<std::__cxx11::string>
                     (pCVar1,&this->importPaths);
  pCVar1 = llbuild::basic::CommandSignature::combine(pCVar1,&this->tempsPath);
  pCVar1 = llbuild::basic::CommandSignature::combine<std::__cxx11::string>(pCVar1,&this->otherArgs);
  pCVar1 = llbuild::basic::CommandSignature::combine(pCVar1,this->isLibrary);
  return (CommandSignature)pCVar1->value;
}

Assistant:

virtual CommandSignature getSignature() const override {
    return ExternalCommand::getSignature()
        .combine(executable)
        .combine(moduleName)
        .combine(moduleAliases)
        .combine(moduleOutputPath)
        .combine(sourcesList)
        .combine(objectsList)
        .combine(importPaths)
        .combine(tempsPath)
        .combine(otherArgs)
        .combine(isLibrary);
  }